

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Assemble(Mat *this,Mat *a,Mat *b)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = a->n_cols_ * a->n_rows_;
  if (0 < (int)uVar3) {
    pdVar1 = a->v_;
    pdVar2 = this->v_;
    uVar4 = 0;
    do {
      pdVar2[uVar4] = pdVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  uVar3 = b->n_cols_ * b->n_rows_;
  if (0 < (int)uVar3) {
    pdVar1 = b->v_;
    pdVar2 = this->v_;
    uVar4 = 0;
    do {
      pdVar2[uVar4] = pdVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void Mat::Assemble(const Mat & a, const Mat &b)
{	
	for (int i=0 ; i<a.Size() ; i++)
		v_[i] = a(i);
	for (int j=0 ; j<b.Size(); j++)
		v_[j] = b(j);
}